

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

int getboolattrib(rnndb *db,char *file,int line,xmlAttr *attr)

{
  int iVar1;
  char *__s1;
  long in_RCX;
  uint in_EDX;
  rnndb *in_RSI;
  long in_RDI;
  char *c;
  xmlAttr *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  __s1 = getattrib(in_RSI,(char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                   (int)((ulong)in_RCX >> 0x20),in_stack_ffffffffffffffd0);
  iVar1 = strcmp(__s1,"yes");
  if ((iVar1 == 0) || (iVar1 = strcmp(__s1,"1"), iVar1 == 0)) {
    return 1;
  }
  iVar1 = strcmp(__s1,"no");
  if ((iVar1 != 0) && (iVar1 = strcmp(__s1,"0"), iVar1 != 0)) {
    fprintf(_stderr,"%s:%d: invalid boolean value \"%s\" in attribute \"%s\"\n",in_RSI,(ulong)in_EDX
            ,__s1,*(undefined8 *)(in_RCX + 0x10));
    *(undefined4 *)(in_RDI + 0x80) = 1;
    return 0;
  }
  return 0;
}

Assistant:

static int getboolattrib (struct rnndb *db, char *file, int line, xmlAttr *attr) {
	char *c = getattrib(db, file, line, attr);
	if (!strcmp(c, "yes") || !strcmp(c, "1"))
		return 1;
	if (!strcmp(c, "no") || !strcmp(c, "0"))
		return 0;
	fprintf (stderr, "%s:%d: invalid boolean value \"%s\" in attribute \"%s\"\n", file, line, c, attr->name);
	db->estatus = 1;
	return 0;
}